

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

void Pdr_ManVerifyInvariant(Pdr_Man_t *p)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *__ptr;
  sat_solver *s;
  Vec_Int_t *pVVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  sat_solver *psVar10;
  ulong uVar11;
  ulong uVar12;
  timespec ts;
  long local_58;
  timespec local_48;
  void **local_38;
  Pdr_Man_t *pPVar9;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    local_58 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_58 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  iVar3 = Pdr_ManFindInvariantStart(p);
  __ptr = Pdr_ManCollectCubes(p,iVar3);
  iVar3 = p->vSolvers->nSize;
  pPVar9 = p;
  s = Pdr_ManCreateSolver(p,iVar3);
  iVar8 = (int)pPVar9;
  uVar1 = __ptr->nSize;
  uVar11 = (ulong)(int)uVar1;
  if (0 < (long)uVar11) {
    ppvVar2 = __ptr->pArray;
    uVar12 = 0;
    do {
      pVVar5 = Pdr_ManCubeToLits(p,iVar3,(Pdr_Set_t *)ppvVar2[uVar12],1,0);
      psVar10 = s;
      iVar4 = sat_solver_addclause(s,pVVar5->pArray,pVVar5->pArray + pVVar5->nSize);
      iVar8 = (int)psVar10;
      if (iVar4 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrInv.c"
                      ,0x209,"void Pdr_ManVerifyInvariant(Pdr_Man_t *)");
      }
      if (s->qtail != s->qhead) {
        psVar10 = s;
        iVar4 = sat_solver_simplify(s);
        iVar8 = (int)psVar10;
        if (iVar4 == 0) {
          __assert_fail("RetValue != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x102,"void sat_solver_compress(sat_solver *)");
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
    if (0 < (int)uVar1) {
      local_38 = __ptr->pArray;
      uVar12 = 0;
      uVar7 = 0;
      do {
        pVVar5 = Pdr_ManCubeToLits(p,iVar3,(Pdr_Set_t *)local_38[uVar12],0,1);
        psVar10 = s;
        iVar4 = sat_solver_solve(s,pVVar5->pArray,pVVar5->pArray + pVVar5->nSize,0,0,0,0);
        iVar8 = (int)psVar10;
        if (iVar4 != -1) {
          Abc_Print(iVar8,"Verification of clause %d failed.\n",uVar12 & 0xffffffff);
          uVar7 = uVar7 + 1;
        }
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
      if (uVar7 != 0) {
        Abc_Print(iVar8,"Verification of %d clauses has failed.\n",(ulong)uVar7);
        goto LAB_005f728a;
      }
    }
  }
  Abc_Print(iVar8,"Verification of invariant with %d clauses was successful.  ",(ulong)uVar1);
  iVar8 = 3;
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar8,"%s =","Time");
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar6 + local_58) / 1000000.0);
LAB_005f728a:
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Pdr_ManVerifyInvariant( Pdr_Man_t * p )
{
    sat_solver * pSat;
    Vec_Int_t * vLits;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, kStart, kThis, RetValue, Counter = 0;
    abctime clk = Abc_Clock();
    // collect cubes used in the inductive invariant
    kStart = Pdr_ManFindInvariantStart( p );
    vCubes = Pdr_ManCollectCubes( p, kStart );
    // create solver with the cubes
    kThis = Vec_PtrSize(p->vSolvers);
    pSat  = Pdr_ManCreateSolver( p, kThis );
    // add the property output
//    Pdr_ManSetPropertyOutput( p, kThis );
    // add the clauses
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        vLits = Pdr_ManCubeToLits( p, kThis, pCube, 1, 0 );
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
        assert( RetValue );
        sat_solver_compress( pSat );
    }
    // check each clause
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        vLits = Pdr_ManCubeToLits( p, kThis, pCube, 0, 1 );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
        if ( RetValue != l_False )
        {
            Abc_Print( 1, "Verification of clause %d failed.\n", i );
            Counter++;
        }
    }
    if ( Counter )
        Abc_Print( 1, "Verification of %d clauses has failed.\n", Counter );
    else
    {
        Abc_Print( 1, "Verification of invariant with %d clauses was successful.  ", Vec_PtrSize(vCubes) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
//    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
}